

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::MessageBuilderGenerator
          (MessageBuilderGenerator *this,Descriptor *descriptor,Context *context)

{
  bool bVar1;
  ClassNameResolver *pCVar2;
  FileDescriptor *descriptor_00;
  LogMessage *pLVar3;
  LogFinisher local_6a;
  byte local_69;
  LogMessage local_68;
  Context *local_20;
  Context *context_local;
  Descriptor *descriptor_local;
  MessageBuilderGenerator *this_local;
  
  this->_vptr_MessageBuilderGenerator = (_func_int **)&PTR__MessageBuilderGenerator_006f7088;
  this->descriptor_ = descriptor;
  this->context_ = context;
  local_20 = context;
  context_local = (Context *)descriptor;
  descriptor_local = (Descriptor *)this;
  pCVar2 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar2;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
            (&this->field_generators_,(Descriptor *)context_local,this->context_);
  local_69 = 0;
  descriptor_00 = Descriptor::file((Descriptor *)context_local);
  bVar1 = Context::EnforceLite(local_20);
  bVar1 = HasDescriptorMethods(descriptor_00,bVar1);
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message_builder.cc"
               ,0x54);
    local_69 = 1;
    pLVar3 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: HasDescriptorMethods(descriptor->file(), context->EnforceLite()): "
                       );
    pLVar3 = internal::LogMessage::operator<<
                       (pLVar3,
                        "Generator factory error: A non-lite message generator is used to generate lite messages."
                       );
    internal::LogFinisher::operator=(&local_6a,pLVar3);
  }
  if ((local_69 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_68);
  }
  return;
}

Assistant:

MessageBuilderGenerator::MessageBuilderGenerator(
    const Descriptor* descriptor, Context* context)
  : descriptor_(descriptor), context_(context),
    name_resolver_(context->GetNameResolver()),
    field_generators_(descriptor, context_) {
  GOOGLE_CHECK(HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A non-lite message generator is used to "
         "generate lite messages.";
}